

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  Statements *this;
  ostream *poVar2;
  Parser parser;
  SymTab symTab;
  Token lastToken;
  Tokenizer tokenizer;
  ifstream inputStream;
  Parser local_3b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>_>
  local_3a8;
  Token local_378;
  Tokenizer local_308;
  ifstream local_218 [520];
  
  if (argc == 2) {
    std::ifstream::ifstream(local_218);
    std::ifstream::open((char *)local_218,(_Ios_Openmode)argv[1]);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Unable top open ",0x10);
      poVar2 = std::operator<<((ostream *)&std::cout,argv[1]);
      std::operator<<(poVar2,". Terminating...");
      main_cold_1();
    }
    else {
      Tokenizer::Tokenizer(&local_308,local_218);
      local_3b0.tokenizer = &local_308;
      this = Parser::fileInput(&local_3b0);
      Tokenizer::getToken(&local_378,&local_308);
      if (local_378._eof != false) {
        local_3a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_3a8._M_impl.super__Rb_tree_header._M_header;
        local_3a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_3a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_3a8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_3a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_3a8._M_impl.super__Rb_tree_header._M_header._M_left;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"INPUT\n",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"********\n",9);
        Statements::print(this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OUTPUT\n",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"********\n",9);
        Statements::evaluate(this,(SymTab *)&local_3a8);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
        std::ostream::put('p');
        poVar2 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,"Symbol table contains the following variables.\n",0x2f);
        SymTab::print((SymTab *)&local_3a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>_>
        ::~_Rb_tree(&local_3a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._string._M_dataplus._M_p != &local_378._string.field_2) {
          operator_delete(local_378._string._M_dataplus._M_p,
                          local_378._string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._relOp._M_dataplus._M_p != &local_378._relOp.field_2) {
          operator_delete(local_378._relOp._M_dataplus._M_p,
                          local_378._relOp.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._name._M_dataplus._M_p != &local_378._name.field_2) {
          operator_delete(local_378._name._M_dataplus._M_p,
                          local_378._name.field_2._M_allocated_capacity + 1);
        }
        std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                  ((_Deque_base<int,_std::allocator<int>_> *)&local_308.indents);
        std::vector<Token,_std::allocator<Token>_>::~vector(&local_308._tokens);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308.lastToken._string._M_dataplus._M_p != &local_308.lastToken._string.field_2)
        {
          operator_delete(local_308.lastToken._string._M_dataplus._M_p,
                          local_308.lastToken._string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308.lastToken._relOp._M_dataplus._M_p != &local_308.lastToken._relOp.field_2) {
          operator_delete(local_308.lastToken._relOp._M_dataplus._M_p,
                          local_308.lastToken._relOp.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308.lastToken._name._M_dataplus._M_p != &local_308.lastToken._name.field_2) {
          operator_delete(local_308.lastToken._name._M_dataplus._M_p,
                          local_308.lastToken._name.field_2._M_allocated_capacity + 1);
        }
        std::ifstream::~ifstream(local_218);
        return 0;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unexpected token in input.",0x1a);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    Token::print(&local_378);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2," nameOfAnInputFile\n");
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc != 2) {
        std::cout << "usage: " << argv[0] << " nameOfAnInputFile\n";
        exit(1);
    }
    std::ifstream inputStream;
    inputStream.open(argv[1], std::ios::in);
    if (!inputStream.is_open()) {
        std::cout << "Unable top open " << argv[1] << ". Terminating...";
        perror("Error when attempting to open the input file.");
        exit(2);
    }
    // Create tokens from Python file 
    Tokenizer tokenizer(inputStream); 

    // Parse tokens converting into matched Python statements
    Parser parser(tokenizer); 
    Statements *statements = parser.fileInput();

    Token lastToken = tokenizer.getToken();
    if (!lastToken.eof()) {
        std::cout << "Unexpected token in input." << std::endl;
        lastToken.print();
        exit(1);
    }
    // Use Symbol table to map variables and data types
    SymTab symTab;
    std::cout << "INPUT\n";
    std::cout << "********\n";
    statements->print();

    std::cout << "OUTPUT\n";
    std::cout << "********\n";

    // Evaluate and calculate Python statements and expressions
    statements->evaluate(symTab);
    std::cout << std::endl << "Symbol table contains the following variables.\n";
    symTab.print();

    return 0;
}